

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O0

bool __thiscall SuperCardPro::WriteExact(SuperCardPro *this,void *buf,int len)

{
  uint uVar1;
  int local_34;
  void *pvStack_30;
  int bytes_written;
  uint8_t *p;
  void *pvStack_20;
  int len_local;
  void *buf_local;
  SuperCardPro *this_local;
  
  local_34 = 0;
  pvStack_30 = buf;
  p._4_4_ = len;
  pvStack_20 = buf;
  buf_local = this;
  while( true ) {
    if ((int)p._4_4_ < 1) {
      usleep(5000);
      return true;
    }
    uVar1 = (*this->_vptr_SuperCardPro[3])(this,pvStack_30,(ulong)p._4_4_,&local_34);
    if ((uVar1 & 1) == 0) break;
    p._4_4_ = p._4_4_ - local_34;
    pvStack_30 = (void *)((long)pvStack_30 + (long)local_34);
  }
  return false;
}

Assistant:

bool SuperCardPro::WriteExact(const void* buf, int len)
{
    auto p = reinterpret_cast<const uint8_t*>(buf);
    auto bytes_written = 0;

    while (len > 0)
    {
        if (!Write(p, len, &bytes_written))
            return false;

        len -= bytes_written;
        p += bytes_written;
    }

#ifndef _WIN32
    // ToDo: find why the Raspberry Pi needs this.
    usleep(5000);
#endif

    return true;
}